

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssi.cpp
# Opt level: O2

int __thiscall pg::SSISolver::mark_solved(SSISolver *this,int side)

{
  bitset *this_00;
  bitset *this_01;
  ulong *puVar1;
  bitset *this_02;
  uint vertex;
  uint64_t *puVar2;
  int **ppiVar3;
  int **ppiVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  ostream *poVar9;
  int *piVar10;
  long lVar11;
  Game *pGVar12;
  int vertex_00;
  ulong uVar13;
  int u;
  uint *puVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  _label_vertex local_78;
  int **local_68;
  int **local_60;
  long local_58;
  int **local_50;
  long local_48;
  _label_vertex local_40;
  
  this_00 = &this->C;
  bVar5 = bitset::none(this_00);
  iVar7 = 0;
  if (!bVar5) {
    this_02 = &this->W0 + (side != 0);
    bitset::operator|=(this_02,this_00);
    for (sVar8 = bitset::find_first(this_00); sVar8 != 0xffffffffffffffff;
        sVar8 = bitset::find_next(this_00,sVar8)) {
      iVar7 = (this->Q).pointer;
      (this->Q).pointer = iVar7 + 1;
      (this->Q).queue[iVar7] = (uint)sVar8;
    }
    this_01 = &this->G;
    local_68 = &this->str0;
    local_50 = &this->str1;
    if (side == 0) {
      local_50 = local_68;
    }
    local_58 = (ulong)(side != 0) * 8 + 0x168;
    iVar7 = 0;
    local_60 = &this->str1;
    while( true ) {
      iVar6 = (this->Q).pointer;
      if ((long)iVar6 == 0) break;
      pGVar12 = (this->super_Solver).game;
      (this->Q).pointer = iVar6 + -1;
      local_48 = (long)(int)(this->Q).queue[(long)iVar6 + -1];
      puVar14 = (uint *)(pGVar12->_inedges + pGVar12->_firstins[local_48]);
      while( true ) {
        vertex = *puVar14;
        uVar13 = (ulong)(int)vertex;
        if (uVar13 == 0xffffffffffffffff) break;
        uVar16 = uVar13 >> 6;
        if (((this_01->_bits[uVar16] >> (uVar13 & 0x3f) & 1) != 0) &&
           (uVar15 = 1L << (uVar13 & 0x3f), (this_02->_bits[uVar16] & uVar15) == 0)) {
          iVar6 = Solver::owner(&this->super_Solver,vertex);
          if (iVar6 == side) {
            (*local_50)[uVar13] = (int)local_48;
          }
          else {
            pGVar12 = (this->super_Solver).game;
            for (piVar10 = pGVar12->_outedges + pGVar12->_firstouts[uVar13];
                uVar13 = (ulong)*piVar10, uVar13 != 0xffffffffffffffff; piVar10 = piVar10 + 1) {
              if ((((this->G)._bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0) &&
                 ((this_02->_bits[uVar13 >> 6] & 1L << (uVar13 & 0x3f)) == 0)) goto LAB_00152397;
            }
          }
          puVar1 = (this->C)._bits + uVar16;
          *puVar1 = *puVar1 | uVar15;
          this_02->_bits[uVar16] = this_02->_bits[uVar16] | uVar15;
          iVar6 = (this->Q).pointer;
          (this->Q).pointer = iVar6 + 1;
          (this->Q).queue[iVar6] = vertex;
        }
LAB_00152397:
        puVar14 = puVar14 + 1;
      }
      iVar7 = iVar7 + 1;
    }
    if (1 < (this->super_Solver).trace) {
      sVar8 = bitset::find_first(this_00);
      pcVar17 = "Odd";
      if (side == 0) {
        pcVar17 = "Even";
      }
      for (; sVar8 != 0xffffffffffffffff; sVar8 = bitset::find_next(this_00,sVar8)) {
        vertex_00 = (int)sVar8;
        iVar6 = Solver::owner(&this->super_Solver,vertex_00);
        poVar9 = std::operator<<((this->super_Solver).logger,"\x1b[1;37mvertex ");
        local_78.v = vertex_00;
        if (iVar6 == side) {
          local_78.g = (this->super_Solver).game;
          poVar9 = operator<<(poVar9,&local_78);
          poVar9 = std::operator<<(poVar9," is now won by ");
          poVar9 = std::operator<<(poVar9,pcVar17);
          poVar9 = std::operator<<(poVar9," with strategy ");
          local_40.g = (this->super_Solver).game;
          local_40.v = *(int *)(*(long *)((long)&(this->super_Solver)._vptr_Solver + local_58) +
                               sVar8 * 4);
          poVar9 = operator<<(poVar9,&local_40);
        }
        else {
          local_78.g = (this->super_Solver).game;
          poVar9 = operator<<(poVar9,&local_78);
          poVar9 = std::operator<<(poVar9," is now won by ");
          poVar9 = std::operator<<(poVar9,pcVar17);
        }
        poVar9 = std::operator<<(poVar9,"!\x1b[m");
        std::endl<char,std::char_traits<char>>(poVar9);
      }
    }
    bitset::operator-=(this_01,this_02);
    bitset::operator&=(&this->V0,this_01);
    bitset::operator&=(&this->V1,this_01);
    ppiVar4 = local_60;
    ppiVar3 = local_68;
    sVar8 = (this->halt0)._bitssize;
    puVar2 = (this->halt0)._bits;
    for (lVar11 = 0; sVar8 << 3 != lVar11; lVar11 = lVar11 + 8) {
      *(undefined8 *)((long)puVar2 + lVar11) = 0;
    }
    sVar8 = (this->halt1)._bitssize;
    puVar2 = (this->halt1)._bits;
    for (lVar11 = 0; sVar8 << 3 != lVar11; lVar11 = lVar11 + 8) {
      *(undefined8 *)((long)puVar2 + lVar11) = 0;
    }
    for (uVar13 = bitset::find_first(this_01); uVar13 != 0xffffffffffffffff;
        uVar13 = bitset::find_next(this_01,uVar13)) {
      uVar16 = (ulong)(*ppiVar3)[uVar13];
      puVar2 = this_01->_bits;
      uVar16 = 1L << (uVar16 & 0x3f) & puVar2[uVar16 >> 6];
      if ((uVar16 == 0) ||
         (uVar15 = (ulong)(*ppiVar4)[uVar13], (puVar2[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0)) {
        pGVar12 = (this->super_Solver).game;
        piVar10 = pGVar12->_outedges + pGVar12->_firstouts[(int)uVar13];
        do {
          iVar6 = *piVar10;
          uVar15 = (ulong)iVar6;
          if (uVar15 == 0xffffffffffffffff) break;
          piVar10 = piVar10 + 1;
        } while ((puVar2[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0);
        if (uVar16 == 0) {
          (*ppiVar3)[uVar13] = iVar6;
        }
        piVar10 = *ppiVar4;
        uVar16 = (ulong)piVar10[uVar13];
        if ((puVar2[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
          piVar10[uVar13] = iVar6;
        }
      }
      else {
        pGVar12 = (this->super_Solver).game;
      }
      puVar1 = (&this->halt0)[(*(byte *)(pGVar12->_priority + (int)uVar13) & 1) == 0]._bits +
               (uVar13 >> 6);
      *puVar1 = *puVar1 | 1L << (uVar13 & 0x3f);
    }
  }
  return iVar7;
}

Assistant:

int
SSISolver::mark_solved(int side)
{
    if (C.none()) return 0;

    auto & W = side == 0 ? W0 : W1;
    auto & S = side == 0 ? str0 : str1;

    // the vertices in C are the new winning region (dominion)
    W |= C;

    // attract to the winning region
    int count = 0;
    for (auto v = C.find_first(); v != bitset::npos; v = C.find_next(v)) {
        Q.push(v);
    }
    while (Q.nonempty()) {
        auto v = Q.pop();
        count++;
        for (auto curedge = ins(v); *curedge != -1; curedge++) {
            auto from = *curedge;
            if (G[from] and !W[from]) {
                if (owner(from) != side) {
                    // check if escapes
                    bool escapes = false;
                    for (auto curedge = outs(from); *curedge != -1; curedge++) {
                        auto to = *curedge;
                        if (G[to] && !W[to]) {
                            escapes = true;
                            break;
                        }
                    }
                    if (escapes) continue;
                } else {
                    S[from] = v;
                }
                C[from] = true;
                W[from] = true;
                Q.push(from);
            }
        }
    }

#ifndef NDEBUG
    if (trace >= 2) {
        for (auto v = C.find_first(); v != bitset::npos; v = C.find_next(v)) {
            if (owner(v) == side) {
                logger << "\033[1;37mvertex " << label_vertex(v) << " is now won by " << (side == 0 ? "Even" : "Odd") << " with strategy " << label_vertex(S[v]) << "!\033[m" << std::endl;
            } else {
                logger << "\033[1;37mvertex " << label_vertex(v) << " is now won by " << (side == 0 ? "Even" : "Odd") << "!\033[m" << std::endl;
            }
        }
    }
#endif

    // remove maximized winning region from remaining game
    G -= W;
    V0 &= G;
    V1 &= G;

    // partially reset the strategies and reset halting
    halt0.reset();
    halt1.reset();
    for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
        if (!G[str0[v]] || !G[str1[v]]) {
            // select first available edge
            int to = -1;
            for (auto curedge = outs(v); *curedge != -1; curedge++) {
                int u = *curedge;
                if (G[u]) {
                    to = u;
                    break;
                }
            }
            if (!G[str0[v]]) str0[v] = to;
            if (!G[str1[v]]) str1[v] = to;
        }

        if (priority(v)&1) {
            halt0[v] = true;
        } else {
            halt1[v] = true;
        }
    }

    return count;
}